

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

UdpPortDeclSyntax * __thiscall slang::parsing::Parser::parseUdpPortDecl(Parser *this,bool *isReg)

{
  SyntaxNode **ppSVar1;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *expr;
  EqualsValueClauseSyntax *initializer;
  IdentifierNameSyntax *pIVar4;
  undefined4 extraout_var;
  UdpInputPortDeclSyntax *pUVar5;
  Info *extraout_RDX;
  Info *src;
  AttrList AVar6;
  Token TVar7;
  Token TVar8;
  Token name;
  Token equals;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> ports;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_128;
  long local_118;
  undefined8 uStack_110;
  size_t local_108;
  AttrList local_100;
  Token local_f0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_e0 [2];
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> local_68;
  
  AVar6 = parseAttributes(this);
  bVar2 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
  if ((bVar2) || (bVar2 = ParserBase::peek(&this->super_ParserBase,RegKeyword), bVar2)) {
    TVar7 = ParserBase::consumeIf(&this->super_ParserBase,OutputKeyword);
    TVar8 = ParserBase::consumeIf(&this->super_ParserBase,RegKeyword);
    name = ParserBase::expect(&this->super_ParserBase,Identifier);
    if ((TVar8.info == (Info *)0x0) || (*isReg = true, TVar7.info == (Info *)0x0)) {
      initializer = (EqualsValueClauseSyntax *)0x0;
    }
    else {
      bVar2 = ParserBase::peek(&this->super_ParserBase,Equals);
      if (bVar2) {
        equals = ParserBase::consume(&this->super_ParserBase);
        expr = parseExpression(this);
        initializer = slang::syntax::SyntaxFactory::equalsValueClause(&this->factory,equals,expr);
      }
      else {
        initializer = (EqualsValueClauseSyntax *)0x0;
      }
    }
    local_e0[0].super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_e0[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_e0[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_e0[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00698d40;
    local_f0 = name;
    local_e0[0].super_SyntaxListBase.childCount = AVar6._M_extent._M_extent_value._M_extent_value;
    local_e0[0].super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> = AVar6
    ;
    pUVar5 = (UdpInputPortDeclSyntax *)
             slang::syntax::SyntaxFactory::udpOutputPortDecl
                       (&this->factory,local_e0,TVar7,TVar8,name,initializer);
  }
  else {
    TVar7 = ParserBase::expect(&this->super_ParserBase,InputKeyword);
    ppSVar1 = &local_e0[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
    local_e0[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
    local_e0[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
    local_e0[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x4;
    local_e0[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)ppSVar1;
    while( true ) {
      TVar8 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pIVar4 = slang::syntax::SyntaxFactory::identifierName(&this->factory,TVar8);
      local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pIVar4;
      local_118._0_1_ = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e0,
                 (TokenOrSyntax *)&local_128._M_first);
      bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
      src = extraout_RDX;
      if (!bVar2) break;
      TVar8 = ParserBase::peek(&this->super_ParserBase,1);
      src = TVar8.info;
      if (TVar8.kind != Identifier) break;
      local_128._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase)
      ;
      local_118 = (ulong)local_118._1_7_ << 8;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e0,
                 (TokenOrSyntax *)&local_128._M_first);
    }
    local_128._8_4_ = 1;
    local_118 = 0;
    uStack_110 = 0;
    local_128._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00698d40;
    local_108 = AVar6._M_extent._M_extent_value._M_extent_value;
    local_100 = AVar6;
    iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_e0,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
    local_68.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00699720;
    pUVar5 = slang::syntax::SyntaxFactory::udpInputPortDecl
                       (&this->factory,
                        (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_128._M_first,
                        TVar7,&local_68);
    if ((SyntaxNode **)local_e0[0].super_SyntaxListBase._vptr_SyntaxListBase != ppSVar1) {
      operator_delete(local_e0[0].super_SyntaxListBase._vptr_SyntaxListBase);
    }
  }
  return &pUVar5->super_UdpPortDeclSyntax;
}

Assistant:

UdpPortDeclSyntax& Parser::parseUdpPortDecl(bool& isReg) {
    auto attrs = parseAttributes();

    if (peek(TokenKind::OutputKeyword) || peek(TokenKind::RegKeyword)) {
        auto output = consumeIf(TokenKind::OutputKeyword);
        auto reg = consumeIf(TokenKind::RegKeyword);
        auto name = expect(TokenKind::Identifier);

        if (reg)
            isReg = true;

        EqualsValueClauseSyntax* init = nullptr;
        if (output && reg && peek(TokenKind::Equals)) {
            auto equals = consume();
            init = &factory.equalsValueClause(equals, parseExpression());
        }

        return factory.udpOutputPortDecl(attrs, output, reg, name, init);
    }

    auto input = expect(TokenKind::InputKeyword);

    SmallVector<TokenOrSyntax, 4> ports;
    while (true) {
        auto name = expect(TokenKind::Identifier);
        ports.push_back(&factory.identifierName(name));

        if (!peek(TokenKind::Comma) || peek(1).kind != TokenKind::Identifier)
            break;

        ports.push_back(consume());
    }

    return factory.udpInputPortDecl(attrs, input, ports.copy(alloc));
}